

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O1

void matrix_expand(matrix *out,uint8_t *rho)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  uint8_t input [34];
  BORINGSSL_keccak_st keccak_ctx;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8;
  undefined1 local_1d7;
  byte local_1c8 [176];
  BORINGSSL_keccak_st local_118;
  
  local_1f8 = *(undefined8 *)rho;
  uStack_1f0 = *(undefined8 *)(rho + 8);
  local_1e8 = *(undefined8 *)(rho + 0x10);
  uStack_1e0 = *(undefined8 *)(rho + 0x18);
  lVar8 = 0;
  do {
    lVar4 = 0;
    do {
      local_1d8 = (undefined1)lVar8;
      local_1d7 = (undefined1)lVar4;
      BORINGSSL_keccak_init(&local_118,boringssl_shake128);
      BORINGSSL_keccak_absorb(&local_118,(uint8_t *)&local_1f8,0x22);
      if (local_118.squeeze_offset != 0) {
        __assert_fail("keccak_ctx->squeeze_offset == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                      ,0x135,
                      "void scalar_from_keccak_vartime(scalar *, struct BORINGSSL_keccak_st *)");
      }
      if (local_118.rate_bytes != 0xa8) {
        __assert_fail("keccak_ctx->rate_bytes == 168",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                      ,0x136,
                      "void scalar_from_keccak_vartime(scalar *, struct BORINGSSL_keccak_st *)");
      }
      iVar5 = 0;
      do {
        BORINGSSL_keccak_squeeze(&local_118,local_1c8,0xa8);
        uVar3 = 0;
        do {
          bVar1 = local_1c8[uVar3 + 1];
          uVar6 = (bVar1 & 0xf) << 8 | (ushort)local_1c8[uVar3];
          bVar2 = local_1c8[uVar3 + 2];
          if (uVar6 < 0xd01) {
            lVar7 = (long)iVar5;
            iVar5 = iVar5 + 1;
            out->v[lVar8][lVar4].c[lVar7] = uVar6;
          }
          uVar6 = (ushort)bVar2 << 4 | (ushort)(bVar1 >> 4);
          if ((uVar6 < 0xd01) && (iVar5 < 0x100)) {
            lVar7 = (long)iVar5;
            iVar5 = iVar5 + 1;
            out->v[lVar8][lVar4].c[lVar7] = uVar6;
          }
        } while ((uVar3 < 0xa5) && (uVar3 = uVar3 + 3, iVar5 < 0x100));
      } while (iVar5 < 0x100);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    lVar8 = lVar8 + 1;
    if (lVar8 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static void matrix_expand(matrix *out, const uint8_t rho[32]) {
  uint8_t input[34];
  OPENSSL_memcpy(input, rho, 32);
  for (int i = 0; i < RANK; i++) {
    for (int j = 0; j < RANK; j++) {
      input[32] = i;
      input[33] = j;
      struct BORINGSSL_keccak_st keccak_ctx;
      BORINGSSL_keccak_init(&keccak_ctx, boringssl_shake128);
      BORINGSSL_keccak_absorb(&keccak_ctx, input, sizeof(input));
      scalar_from_keccak_vartime(&out->v[i][j], &keccak_ctx);
    }
  }
}